

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O3

Ref __thiscall trun::TestRunner::CreateTestFunc(TestRunner *this,string *symbol)

{
  long lVar1;
  ILogger *pIVar2;
  ulong uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar4;
  kState kVar5;
  kExecState kVar6;
  Ref RVar7;
  string testCase;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  funcparts;
  undefined1 local_a8 [40];
  size_type sStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  kState local_68;
  kExecState kStack_64;
  kTestScope kStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  kState local_48;
  kExecState kStack_44;
  kTestScope kStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  local_a8._32_8_ = (pointer)0x0;
  sStack_80 = 0;
  local_78._M_allocated_capacity = 0;
  split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(local_a8 + 0x20),(symbol->_M_dataplus)._M_p,0x5f);
  lVar1 = (long)(sStack_80 - local_a8._32_8_) >> 5;
  if (lVar1 == 3) {
    TestFunc::Create((TestFunc *)local_a8,symbol,(string *)(local_a8._32_8_ + 0x20),
                     (string *)(local_a8._32_8_ + 0x40));
    kVar5 = local_a8._0_4_;
    kVar6 = local_a8._4_4_;
  }
  else if (lVar1 == 2) {
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"-","");
    TestFunc::Create((TestFunc *)&stack0xffffffffffffff98,symbol,(string *)local_a8,
                     (string *)(local_a8._32_8_ + 0x20));
    kVar5 = local_68;
    kVar6 = kStack_64;
    local_a8._8_4_ = kStack_60;
    local_a8._12_4_ = uStack_5c;
    _local_68 = (char *)0x0;
    _kStack_60 = 0;
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
LAB_0010b7ee:
      local_48 = kVar5;
      kStack_44 = kVar6;
      kStack_40 = local_a8._8_4_;
      uStack_3c = local_a8._12_4_;
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      kVar5 = local_48;
      kVar6 = kStack_44;
      local_a8._8_4_ = kStack_40;
      local_a8._12_4_ = uStack_3c;
    }
  }
  else {
    if (lVar1 == 1) {
      local_a8._0_8_ = local_a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"TestRunner","");
      pIVar2 = gnilk::Logger::GetLogger((string *)local_a8);
      (*pIVar2->_vptr_ILogger[5])
                (pIVar2,
                 "Bare test function: \'%s\' (skipping), consider renaming: (test_<library>_<case>)"
                 ,(symbol->_M_dataplus)._M_p);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      this->pLogger = (ILogger *)0x0;
      (this->library).super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      goto LAB_0010b809;
    }
    local_a8._0_8_ = local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
    local_38 = this;
    if (0x40 < sStack_80 - local_a8._32_8_) {
      uVar4 = 2;
      lVar1 = 0x48;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   *(char **)(local_a8._32_8_ + lVar1 + -8),*(size_type *)(local_a8._32_8_ + lVar1))
        ;
        uVar3 = (long)(sStack_80 - local_a8._32_8_) >> 5;
        if (uVar4 < uVar3 - 1) {
          _local_68 = (pointer)&stack0xffffffffffffffa8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xffffffffffffff98,"_","")
          ;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                     _local_68,_kStack_60);
          if (_local_68 != (pointer)&stack0xffffffffffffffa8) {
            operator_delete(_local_68,local_58 + 1);
          }
          uVar3 = (long)(sStack_80 - local_a8._32_8_) >> 5;
        }
        uVar4 = uVar4 + 1;
        lVar1 = lVar1 + 0x20;
      } while (uVar4 < uVar3);
    }
    TestFunc::Create((TestFunc *)&stack0xffffffffffffff98,symbol,(string *)(local_a8._32_8_ + 0x20),
                     (string *)local_a8);
    this = (TestRunner *)local_38;
    kVar5 = local_68;
    kVar6 = kStack_64;
    local_a8._8_4_ = kStack_60;
    local_a8._12_4_ = uStack_5c;
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) goto LAB_0010b7ee;
  }
  *(kState *)&(((element_type *)this)->symbolName)._M_dataplus._M_p = kVar5;
  *(kExecState *)((long)&(((element_type *)this)->symbolName)._M_dataplus._M_p + 4) = kVar6;
  *(undefined4 *)
   &(((Ref *)&(((element_type *)this)->symbolName)._M_string_length)->
    super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_a8._8_4_;
  *(undefined4 *)
   ((long)&(((Ref *)&(((element_type *)this)->symbolName)._M_string_length)->
           super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 4) =
       local_a8._12_4_;
LAB_0010b809:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_a8 + 0x20));
  RVar7.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar7.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (Ref)RVar7.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TestFunc::Ref TestRunner::CreateTestFunc(const std::string &symbol) {
    TestFunc::Ref func = nullptr;

    std::vector<std::string> funcparts;
    trun::split(funcparts, symbol.c_str(), '_');

    if (funcparts.size() == 1) {
        gnilk::Logger::GetLogger("TestRunner")->Warning("Bare test function: '%s' (skipping), consider renaming: (test_<library>_<case>)", symbol.c_str());
        return nullptr;
    } else if (funcparts.size() == 2) {
        func = TestFunc::Create(symbol,"-", funcparts[1]);
    } else if (funcparts.size() == 3) {
        func = TestFunc::Create(symbol, funcparts[1], funcparts[2]);
    } else {
        // merge '3' and onwards
        std::string testCase = "";
        for(size_t i=2;i<funcparts.size();i++) {
            testCase += funcparts[i];
            if (i<(funcparts.size()-1)) {
                testCase += std::string("_");
            }
        }
        func = TestFunc::Create(symbol, funcparts[1], testCase);
    }

    return func;
}